

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall asmjit::BaseRAPass::runLocalAllocator(BaseRAPass *this)

{
  RABlocks *this_00;
  InstNode *pIVar1;
  BaseNode *pBVar2;
  RABlock *target;
  BaseBuilder *pBVar3;
  WorkToPhysMap *__src;
  bool bVar4;
  Error EVar5;
  RABlock **ppRVar6;
  InstNode *pIVar7;
  RABlock *block;
  BaseNode *pBVar8;
  InstNode *pIVar9;
  RABlock *block_00;
  BaseRAPass *ctx;
  uint uVar10;
  ulong i;
  size_type sVar11;
  InstNode *node;
  InstNode *inst;
  RABlocks *successors;
  RALocalAllocator lra;
  RALocalAllocator local_118;
  
  ctx = this;
  RALocalAllocator::RALocalAllocator(&local_118,this);
  EVar5 = RALocalAllocator::init(&local_118,(EVP_PKEY_CTX *)ctx);
  if (EVar5 == 0) {
    if ((this->_blocks).super_ZoneVectorBase._size != 0) {
      sVar11 = (this->_pov).super_ZoneVectorBase._size;
      ppRVar6 = ZoneVector<asmjit::RABlock_*>::operator[](&this->_blocks,0);
      block_00 = *ppRVar6;
      if ((block_00->_flags & 2) == 0) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/rapass.cpp"
                   ,0x522,"block->isReachable()");
      }
      RALocalAllocator::makeInitialAssignment(&local_118);
      EVar5 = setBlockEntryAssignment(this,block_00,block_00,&local_118._curAssignment);
      if (EVar5 != 0) {
        return EVar5;
      }
      i = 0;
LAB_0011bba1:
      pIVar7 = (InstNode *)block_00->_first;
      pIVar9 = (InstNode *)block_00->_last;
      uVar10 = block_00->_flags;
      pIVar1 = (InstNode *)(pIVar9->super_BaseNode).field_0.field_0._next;
      if ((uVar10 >> 8 & 1) == 0) {
        pIVar9 = (InstNode *)0x0;
      }
      pBVar2 = (pIVar7->super_BaseNode).field_0.field_0._prev;
      block = (RABlock *)0x0;
      if ((block_00->_successors).super_ZoneVectorBase._size != 0) {
        ppRVar6 = ZoneVector<asmjit::RABlock_*>::operator[](&block_00->_successors,0);
        block = *ppRVar6;
        uVar10 = block_00->_flags;
      }
      block_00->_flags = uVar10 | 8;
      this_00 = &block_00->_successors;
      bVar4 = false;
      local_118._block = block_00;
      while (node = pIVar7, node != pIVar1) {
        pIVar7 = (InstNode *)(node->super_BaseNode).field_0._links[1];
        if (((node->super_BaseNode).field_1._any._nodeFlags & 0x20) != 0) {
          if (node == pIVar9) {
            if ((block_00->_flags & 0x200) == 0) {
              if ((block_00->_successors).super_ZoneVectorBase._size < 2) {
                bVar4 = true;
                goto LAB_0011bc2d;
              }
              EVar5 = RALocalAllocator::allocJumpTable(&local_118,node,this_00,(RABlock *)0x0);
            }
            else {
              ppRVar6 = ZoneVector<asmjit::RABlock_*>::last(this_00);
              target = *ppRVar6;
              ppRVar6 = ZoneVector<asmjit::RABlock_*>::first(this_00);
              EVar5 = RALocalAllocator::allocBranch(&local_118,node,target,*ppRVar6);
            }
          }
          else {
LAB_0011bc2d:
            EVar5 = RALocalAllocator::allocInst(&local_118,node);
            if (EVar5 != 0) {
              return EVar5;
            }
            if ((node->super_BaseNode).field_1._any._nodeType == '\x12') {
              EVar5 = (*(this->super_FuncPass).super_Pass._vptr_Pass[0xe])(this);
            }
            else {
              EVar5 = RALocalAllocator::spillAfterAllocation(&local_118,node);
            }
          }
          if (EVar5 != 0) {
            return EVar5;
          }
        }
      }
      if (block != (RABlock *)0x0) {
        pBVar3 = (this->super_FuncPass).super_Pass._cb;
        pIVar7 = (InstNode *)&pBVar3->_lastNode;
        if (pIVar1 != (InstNode *)0x0) {
          pIVar7 = pIVar1;
        }
        pBVar8 = (pIVar7->super_BaseNode).field_0.field_0._prev;
        if (bVar4) {
          pBVar8 = (pBVar8->field_0).field_0._prev;
        }
        pBVar3->_cursor = pBVar8;
        if (block->_entryPhysToWorkMap == (PhysToWorkMap *)0x0) {
          EVar5 = RALocalAllocator::spillRegsBeforeEntry(&local_118,block);
          if (EVar5 != 0) {
            return EVar5;
          }
          EVar5 = setBlockEntryAssignment(this,block,block_00,&local_118._curAssignment);
          if (EVar5 != 0) {
            return EVar5;
          }
          __src = block->_entryWorkToPhysMap;
          memcpy(local_118._curAssignment._physToWorkMap,block->_entryPhysToWorkMap,
                 (ulong)local_118._curAssignment._layout.physTotal * 4 + 0x20);
          memcpy(local_118._curAssignment._workToPhysMap,__src,
                 (ulong)local_118._curAssignment._layout.workCount);
        }
        else {
          EVar5 = RALocalAllocator::switchToAssignment
                            (&local_118,block->_entryPhysToWorkMap,block->_entryWorkToPhysMap,
                             block->_liveBits,SUB41((block->_flags & 8) >> 3,0),false);
          if (EVar5 != 0) {
            return EVar5;
          }
        }
      }
      block_00->_first = (pBVar2->field_0).field_0._next;
      pIVar7 = (InstNode *)&((this->super_FuncPass).super_Pass._cb)->_lastNode;
      if (pIVar1 != (InstNode *)0x0) {
        pIVar7 = pIVar1;
      }
      block_00->_last = (pIVar7->super_BaseNode).field_0.field_0._prev;
      sVar11 = sVar11 - 1;
      if (sVar11 != 0) {
        if ((block == (RABlock *)0x0) || (block_00 = block, (block->_flags & 8) != 0)) {
          do {
            uVar10 = (int)i + 1;
            if ((this->_blocks).super_ZoneVectorBase._size <= uVar10) {
              uVar10 = 0;
            }
            i = (ulong)uVar10;
            ppRVar6 = ZoneVector<asmjit::RABlock_*>::operator[](&this->_blocks,i);
            block_00 = *ppRVar6;
          } while (((block_00->_flags & 10) != 2) ||
                  (block_00->_entryPhysToWorkMap == (PhysToWorkMap *)0x0));
          RALocalAllocator::replaceAssignment
                    (&local_118,block_00->_entryPhysToWorkMap,block_00->_entryWorkToPhysMap);
        }
        goto LAB_0011bba1;
      }
      RARegMask::op<asmjit::Support::Or>(&this->_clobberedRegs,&local_118._clobberedRegs);
    }
    EVar5 = 0;
  }
  return EVar5;
}

Assistant:

Error BaseRAPass::runLocalAllocator() noexcept {
  RALocalAllocator lra(this);
  ASMJIT_PROPAGATE(lra.init());

  if (!blockCount())
    return kErrorOk;

  // The allocation is done when this reaches zero.
  uint32_t blocksRemaining = reachableBlockCount();

  // Current block.
  uint32_t blockId = 0;
  RABlock* block = _blocks[blockId];

  // The first block (entry) must always be reachable.
  ASMJIT_ASSERT(block->isReachable());

  // Assign function arguments for the initial block. The `lra` is valid now.
  lra.makeInitialAssignment();
  ASMJIT_PROPAGATE(setBlockEntryAssignment(block, block, lra._curAssignment));

  // The loop starts from the first block and iterates blocks in order, however,
  // the algorithm also allows to jump to any other block when finished if it's
  // a jump target. In-order iteration just makes sure that all blocks are visited.
  for (;;) {
    BaseNode* first = block->first();
    BaseNode* last = block->last();
    BaseNode* terminator = block->hasTerminator() ? last : nullptr;

    BaseNode* beforeFirst = first->prev();
    BaseNode* afterLast = last->next();

    bool unconditionalJump = false;
    RABlock* consecutive = nullptr;

    if (block->hasSuccessors())
      consecutive = block->successors()[0];

    lra.setBlock(block);
    block->makeAllocated();

    BaseNode* node = first;
    while (node != afterLast) {
      BaseNode* next = node->next();
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();

        if (ASMJIT_UNLIKELY(inst == terminator)) {
          const RABlocks& successors = block->successors();
          if (block->hasConsecutive()) {
            ASMJIT_PROPAGATE(lra.allocBranch(inst, successors.last(), successors.first()));

            node = next;
            continue;
          }
          else if (successors.size() > 1) {
            RABlock* cont = block->hasConsecutive() ? successors.first() : nullptr;
            ASMJIT_PROPAGATE(lra.allocJumpTable(inst, successors, cont));

            node = next;
            continue;
          }
          else {
            // Otherwise this is an unconditional jump, special handling isn't required.
            unconditionalJump = true;
          }
        }

        ASMJIT_PROPAGATE(lra.allocInst(inst));
        if (inst->type() == BaseNode::kNodeInvoke)
          ASMJIT_PROPAGATE(emitPreCall(inst->as<InvokeNode>()));
        else
          ASMJIT_PROPAGATE(lra.spillAfterAllocation(inst));
      }
      node = next;
    }

    if (consecutive) {
      BaseNode* prev = afterLast ? afterLast->prev() : cc()->lastNode();
      cc()->_setCursor(unconditionalJump ? prev->prev() : prev);

      if (consecutive->hasEntryAssignment()) {
        ASMJIT_PROPAGATE(
          lra.switchToAssignment(
            consecutive->entryPhysToWorkMap(),
            consecutive->entryWorkToPhysMap(),
            consecutive->liveIn(),
            consecutive->isAllocated(),
            false));
      }
      else {
        ASMJIT_PROPAGATE(lra.spillRegsBeforeEntry(consecutive));
        ASMJIT_PROPAGATE(setBlockEntryAssignment(consecutive, block, lra._curAssignment));
        lra._curAssignment.copyFrom(consecutive->entryPhysToWorkMap(), consecutive->entryWorkToPhysMap());
      }
    }

    // Important as the local allocator can insert instructions before
    // and after any instruction within the basic block.
    block->setFirst(beforeFirst->next());
    block->setLast(afterLast ? afterLast->prev() : cc()->lastNode());

    if (--blocksRemaining == 0)
      break;

    // Switch to the next consecutive block, if any.
    if (consecutive) {
      block = consecutive;
      if (!block->isAllocated())
        continue;
    }

    // Get the next block.
    for (;;) {
      if (++blockId >= blockCount())
        blockId = 0;

      block = _blocks[blockId];
      if (!block->isReachable() || block->isAllocated() || !block->hasEntryAssignment())
        continue;

      break;
    }

    // If we switched to some block we have to update the local allocator.
    lra.replaceAssignment(block->entryPhysToWorkMap(), block->entryWorkToPhysMap());
  }

  _clobberedRegs.op<Support::Or>(lra._clobberedRegs);
  return kErrorOk;
}